

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall cmInstallExportGenerator::ComputeTempDir(cmInstallExportGenerator *this)

{
  string *input;
  string *psVar1;
  size_type sVar2;
  size_type sVar3;
  size_t sVar4;
  ulong uVar5;
  string dest;
  char local_42 [2];
  string local_40;
  
  cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  psVar1 = &this->TempDir;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    input = &(this->super_cmInstallGenerator).Destination;
    std::__cxx11::string::append((char *)psVar1);
    sVar2 = (this->TempDir)._M_string_length;
    sVar3 = (this->FileName)._M_string_length;
    sVar4 = GetMaxConfigLength(this);
    uVar5 = sVar4 + sVar2 + sVar3 + 2;
    if ((uVar5 < 1000) &&
       ((this->super_cmInstallGenerator).Destination._M_string_length <= 1000 - uVar5)) {
      std::__cxx11::string::string((string *)&local_40,(string *)input);
      if (*local_40._M_dataplus._M_p == '/') {
        *local_40._M_dataplus._M_p = '_';
      }
      local_42[1] = 0x3a;
      local_42[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_40._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_40._M_dataplus._M_p + local_40._M_string_length),local_42 + 1,local_42);
      cmsys::SystemTools::ReplaceString(&local_40,"../","__/");
      local_42[1] = 0x20;
      local_42[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_40._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_40._M_dataplus._M_p + local_40._M_string_length),local_42 + 1,local_42);
      std::__cxx11::string::append((string *)psVar1);
    }
    else {
      cmSystemTools::ComputeStringMD5(&local_40,input);
      std::__cxx11::string::append((string *)psVar1);
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::ComputeTempDir()
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  this->TempDir = this->LocalGenerator->GetCurrentBinaryDirectory();
  this->TempDir += cmake::GetCMakeFilesDirectory();
  this->TempDir += "/Export";
  if (this->Destination.empty()) {
    return;
  }
  this->TempDir += "/";

  // Enforce a maximum length.
  bool useMD5 = false;
#if defined(_WIN32) || defined(__CYGWIN__)
  std::string::size_type const max_total_len = 250;
#else
  std::string::size_type const max_total_len = 1000;
#endif
  // Will generate files of the form "<temp-dir>/<base>-<config>.<ext>".
  std::string::size_type const len = this->TempDir.size() + 1 +
    this->FileName.size() + 1 + this->GetMaxConfigLength();
  if (len < max_total_len) {
    // Keep the total path length below the limit.
    std::string::size_type const max_len = max_total_len - len;
    if (this->Destination.size() > max_len) {
      useMD5 = true;
    }
  } else {
    useMD5 = true;
  }
  if (useMD5) {
    // Replace the destination path with a hash to keep it short.
    this->TempDir += cmSystemTools::ComputeStringMD5(this->Destination);
  } else {
    std::string dest = this->Destination;
    // Avoid unix full paths.
    if (dest[0] == '/') {
      dest[0] = '_';
    }
    // Avoid windows full paths by removing colons.
    std::replace(dest.begin(), dest.end(), ':', '_');
    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(dest, "../", "__/");
    // Avoid spaces.
    std::replace(dest.begin(), dest.end(), ' ', '_');
    this->TempDir += dest;
  }
}